

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

bool __thiscall Clasp::Solver::force(Solver *this,ImpliedLiteral *p)

{
  bool bVar1;
  uint32 uVar2;
  ImpliedLiteral *pIVar3;
  Antecedent *x_00;
  Literal *in_RSI;
  Solver *in_RDI;
  ImpliedLiteral *x;
  undefined4 in_stack_ffffffffffffff88;
  uint32 in_stack_ffffffffffffff8c;
  Solver *in_stack_ffffffffffffff90;
  Solver *in_stack_ffffffffffffff98;
  ImpliedList *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  uint32 in_stack_ffffffffffffffac;
  ImpliedList *in_stack_ffffffffffffffb0;
  Literal p_00;
  Literal *in_stack_ffffffffffffffb8;
  
  bVar1 = isTrue(in_stack_ffffffffffffff98,
                 (Literal)(uint32)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
  if (bVar1) {
    Literal::var(in_RSI);
    uVar2 = level(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    if (uVar2 <= in_RSI[1].rep_) {
      return true;
    }
    pIVar3 = ImpliedList::find((ImpliedList *)in_stack_ffffffffffffff90,
                               (Literal)(uint32)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    if (pIVar3 != (ImpliedLiteral *)0x0) {
      if (in_RSI[1].rep_ < pIVar3->level) {
        ImpliedLiteral::operator=
                  ((ImpliedLiteral *)in_stack_ffffffffffffff90,
                   (ImpliedLiteral *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        p_00.rep_ = (uint32)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
        uVar2 = (uint32)((ulong)in_stack_ffffffffffffff98 >> 0x20);
        ReasonStore64::value_type::ante((value_type *)(in_RSI + 2));
        ReasonStore64::value_type::data((value_type *)(in_RSI + 2));
        setReason((Solver *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),p_00,
                  (Antecedent *)in_stack_ffffffffffffffa0,uVar2);
      }
      return true;
    }
  }
  uVar2 = undoUntil(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  if (uVar2 != in_RSI[1].rep_) {
    in_stack_ffffffffffffffb0 = &in_RDI->impliedLits_;
    decisionLevel((Solver *)0x1ea2ce);
    ImpliedList::add(in_stack_ffffffffffffffa0,(uint32)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                     (ImpliedLiteral *)in_stack_ffffffffffffff90);
  }
  bVar1 = isTrue(in_stack_ffffffffffffff98,
                 (Literal)(uint32)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
  uVar2 = (uint32)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  if (bVar1) {
    x_00 = ReasonStore64::value_type::ante((value_type *)(in_RSI + 2));
    ReasonStore64::value_type::data((value_type *)(in_RSI + 2));
    bVar1 = setReason((Solver *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                      (Literal)(uint32)((ulong)in_stack_ffffffffffffffb0 >> 0x20),x_00,uVar2);
    in_stack_ffffffffffffffac = CONCAT13(1,(int3)in_stack_ffffffffffffffac);
    if (bVar1) goto LAB_001ea391;
  }
  ReasonStore64::value_type::ante((value_type *)(in_RSI + 2));
  ReasonStore64::value_type::data((value_type *)(in_RSI + 2));
  bVar1 = force(in_RDI,in_stack_ffffffffffffffb8,(Antecedent *)in_stack_ffffffffffffffb0,
                in_stack_ffffffffffffffac);
  in_stack_ffffffffffffffac = (uint)bVar1 << 0x18;
LAB_001ea391:
  return SUB41(in_stack_ffffffffffffffac >> 0x18,0);
}

Assistant:

bool Solver::force(const ImpliedLiteral& p) {
	// Already implied?
	if (isTrue(p.lit)) {
		if (level(p.lit.var()) <= p.level) { return true; }
		if (ImpliedLiteral* x = impliedLits_.find(p.lit)) {
			if (x->level > p.level) {
				*x = p;
				setReason(p.lit, p.ante.ante(), p.ante.data());
			}
			return true;
		}
	}
	if (undoUntil(p.level) != p.level) {
		// Logically the implication is on level p.level.
		// Store enough information so that p can be re-assigned once we backtrack.
		impliedLits_.add(decisionLevel(), p);
	}
	return (isTrue(p.lit) && setReason(p.lit, p.ante.ante(), p.ante.data())) || force(p.lit, p.ante.ante(), p.ante.data());
}